

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiasLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  BiasLayerParams *this_00;
  WeightParams *pWVar6;
  string *psVar7;
  uint64 uVar8;
  allocator local_361;
  string local_360;
  allocator local_339;
  string local_338;
  Result local_318;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  Result local_2a0;
  int local_274;
  uint64_t uStack_270;
  int i;
  size_t total_shape;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string err;
  WeightParamType paramType;
  BiasLayerParams *params;
  string local_148;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar3 = Result::good((Result *)local_48);
  if (bVar3) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar3 = Result::good((Result *)local_48);
  uVar2 = r.m_message.field_2._8_8_;
  if (!bVar3) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a23d21;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"Bias",&local_f9);
    validateInputOutputRankEquality
              (&local_d8,(NeuralNetworkLayer *)uVar2,&local_f8,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_d8);
    Result::~Result(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    bVar3 = Result::good((Result *)local_48);
    uVar2 = r.m_message.field_2._8_8_;
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a23d21;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"Bias",(allocator *)((long)&params + 7));
    validateRankCount(&local_128,(NeuralNetworkLayer *)uVar2,&local_148,3,-1,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_128);
    Result::~Result(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar3 = Result::good((Result *)local_48);
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a23d21;
    }
  }
  this_00 = Specification::NeuralNetworkLayer::bias((NeuralNetworkLayer *)r.m_message.field_2._8_8_)
  ;
  pWVar6 = Specification::BiasLayerParams::bias(this_00);
  err.field_2._12_4_ = valueType(pWVar6);
  if (err.field_2._12_4_ == UNSPECIFIED) {
    psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+(&local_1a0,"Bias product layer \'",psVar7);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   &local_1a0,
                   "\' has both full precision and half precision weights and/or bias fields populated"
                  );
    std::__cxx11::string::~string((string *)&local_1a0);
    Result::Result((Result *)((long)&err_1.field_2 + 8),INVALID_MODEL_PARAMETERS,(string *)local_180
                  );
    Result::operator=((Result *)local_48,(Result *)((long)&err_1.field_2 + 8));
    Result::~Result((Result *)((long)&err_1.field_2 + 8));
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    std::__cxx11::string::~string((string *)local_180);
  }
  else {
    iVar4 = Specification::BiasLayerParams::shape_size(this_00);
    if ((iVar4 == 1) || (iVar4 = Specification::BiasLayerParams::shape_size(this_00), iVar4 == 3)) {
      uStack_270 = 1;
      for (local_274 = 0; iVar4 = local_274,
          iVar5 = Specification::BiasLayerParams::shape_size(this_00), iVar4 < iVar5;
          local_274 = local_274 + 1) {
        uVar8 = Specification::BiasLayerParams::shape(this_00,local_274);
        uStack_270 = uVar8 * uStack_270;
      }
      iVar4 = Specification::BiasLayerParams::shape_size(this_00);
      if ((iVar4 == 3) && (uVar8 = Specification::BiasLayerParams::shape(this_00,0), 1 < uVar8)) {
        pWVar6 = Specification::BiasLayerParams::bias(this_00);
        uVar1 = uStack_270;
        uVar8 = Specification::BiasLayerParams::shape(this_00,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c0,"Bias",&local_2c1);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2e8,"bias",&local_2e9);
        validateGeneralWeightParams(&local_2a0,pWVar6,uVar1,uVar8,&local_2c0,psVar7,&local_2e8);
        Result::operator=((Result *)local_48,&local_2a0);
        Result::~Result(&local_2a0);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      }
      else {
        pWVar6 = Specification::BiasLayerParams::bias(this_00);
        uVar1 = uStack_270;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_338,"Bias",&local_339);
        psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_360,"bias",&local_361);
        validateGeneralWeightParams(&local_318,pWVar6,uVar1,1,&local_338,psVar7,&local_360);
        Result::operator=((Result *)local_48,&local_318);
        Result::~Result(&local_318);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        std::__cxx11::string::~string((string *)&local_338);
        std::allocator<char>::~allocator((allocator<char> *)&local_339);
      }
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
    }
    else {
      psVar7 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_248,"Bias layer \'",psVar7);
      std::operator+(&local_228,&local_248,"\' cannot be ");
      iVar4 = Specification::BiasLayerParams::shape_size(this_00);
      std::__cxx11::to_string((string *)&total_shape,iVar4);
      std::operator+(&local_208,&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &total_shape);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     &local_208," dimensional. Must be 1D or 3D.");
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&total_shape);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1e8);
      local_ac = 1;
      std::__cxx11::string::~string((string *)local_1e8);
    }
  }
LAB_00a23d21:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiasLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Bias", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Bias", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.bias();
    WeightParamType paramType = valueType(params.bias());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Bias product layer '" + layer.name() + "' has both full precision and half precision weights and/or bias fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    if (params.shape_size() != 1 && params.shape_size() != 3) {
        std::string err = "Bias layer '" + layer.name() + "' cannot be " + std::to_string(params.shape_size()) + " dimensional. Must be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // shape can be ``[1]``, ``[C]``, ``[1, H, W]`` or ``[C, H, W]``
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.bias(), total_shape, params.shape(0), "Bias", layer.name(), "bias");
    } else {
        r = validateGeneralWeightParams(params.bias(), total_shape, 1, "Bias", layer.name(), "bias");
    }

    return r;
}